

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-validate.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  ostream *poVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  size_type sVar12;
  bool bVar13;
  string infile;
  string s;
  Validator validator;
  ifstream ifs;
  char buffer [32768];
  int local_829c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8278;
  ulong local_8258;
  Validator local_8250;
  long local_8240;
  size_type local_8238;
  int aiStack_8220 [122];
  undefined1 local_8038 [29];
  undefined4 local_801b;
  undefined2 local_8017;
  bool local_8015;
  undefined8 local_8014;
  uint32_t local_800c;
  
  local_8258 = 0;
  bVar13 = true;
  iVar11 = 1;
  pcVar9 = (char *)0x0;
  local_829c = 0;
  while (iVar11 < argc) {
    pcVar10 = argv[iVar11];
    if (bVar13) {
      iVar5 = strcmp(pcVar10,"--help");
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar10,"--hex");
        if (iVar5 == 0) {
          local_8258 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
          pcVar10 = pcVar9;
        }
        else {
          iVar5 = strcmp(pcVar10,"--");
          if (iVar5 != 0) goto LAB_00102c1d;
          bVar13 = false;
          pcVar10 = pcVar9;
        }
        goto LAB_00102c5d;
      }
      bVar2 = false;
      usage(argv);
      local_829c = 0;
    }
    else {
LAB_00102c1d:
      if (pcVar9 == (char *)0x0) {
LAB_00102c5d:
        iVar11 = iVar11 + 1;
        bVar2 = true;
        pcVar9 = pcVar10;
      }
      else {
        usage(argv);
        local_829c = 1;
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return local_829c;
    }
  }
  pcVar10 = "-";
  if (pcVar9 != (char *)0x0) {
    pcVar10 = pcVar9;
  }
  local_8298._M_dataplus._M_p = (pointer)&local_8298.field_2;
  sVar6 = strlen(pcVar10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8298,pcVar10,pcVar10 + sVar6);
  iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&local_8298,"-");
  if (iVar11 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_8298,0,local_8298._M_string_length,"/proc/self/fd/0",0xf);
  }
  local_8278._M_string_length = 0;
  local_8278.field_2._M_local_buf[0] = '\0';
  local_8278._M_dataplus._M_p = (pointer)&local_8278.field_2;
  std::ifstream::ifstream(&local_8240,(string *)&local_8298,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot read infile \'",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_8298._M_dataplus._M_p,
                        local_8298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    local_829c = 1;
    std::ostream::flush();
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_8278,0x8000);
    while (*(int *)((long)aiStack_8220 + *(long *)(local_8240 + -0x18)) == 0) {
      std::istream::read((char *)&local_8240,(long)local_8038);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_8278,local_8038,local_8238);
    }
    std::ifstream::close();
    if ((local_8258 & 1) != 0) {
      local_8038._8_8_ = (AttributeTranslator *)0x0;
      local_8038[0x10] = '\0';
      local_8038._0_8_ = local_8038 + 0x10;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038,
                 local_8278._M_string_length);
      sVar3 = local_8278._M_string_length;
      if (local_8278._M_string_length != 0) {
        sVar12 = 0;
        iVar11 = -1;
        do {
          bVar1 = local_8278._M_dataplus._M_p[sVar12];
          iVar5 = -0x30;
          if (((byte)(bVar1 - 0x30) < 10) || (iVar5 = -0x57, (byte)(bVar1 + 0x9f) < 6)) {
LAB_00102f8e:
            iVar8 = iVar5 + (uint)bVar1;
            if (iVar11 != -1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_8038,(char)iVar8 + (char)(iVar11 << 4));
              iVar8 = -1;
            }
          }
          else {
            iVar8 = -1;
            iVar5 = -0x37;
            if ((byte)(bVar1 + 0xbf) < 6) goto LAB_00102f8e;
          }
          sVar12 = sVar12 + 1;
          iVar11 = iVar8;
        } while (sVar3 != sVar12);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_8278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038);
      if ((undefined1 *)local_8038._0_8_ != local_8038 + 0x10) {
        operator_delete((void *)local_8038._0_8_,
                        CONCAT35(local_8038._21_3_,CONCAT41(local_8038._17_4_,local_8038[0x10])) + 1
                       );
      }
    }
    local_8038._0_8_ = (pointer)0x200000002;
    local_8038._8_8_ = (AttributeTranslator *)0x0;
    local_8038[0x10] = '\0';
    local_8038._17_4_ = 0;
    local_8038._21_3_ = 0;
    local_8038[0x18] = false;
    local_8038[0x19] = false;
    local_8038[0x1a] = false;
    local_8038[0x1b] = false;
    local_8038[0x1c] = false;
    local_8017._0_1_ = true;
    local_8017._1_1_ = false;
    local_8015 = true;
    local_8014._0_1_ = false;
    local_8014._1_1_ = false;
    local_8014._2_1_ = false;
    local_8014._3_1_ = false;
    local_8014._4_1_ = false;
    local_8014._5_1_ = false;
    local_8014._6_1_ = false;
    local_8014._7_1_ = false;
    local_800c = 0xffffffff;
    local_801b._0_1_ = true;
    local_801b._1_1_ = true;
    local_801b._2_1_ = true;
    local_801b._3_1_ = false;
    arangodb::velocypack::Validator::Validator(&local_8250,(Options *)local_8038);
    arangodb::velocypack::Validator::validate
              (&local_8250,(uint8_t *)local_8278._M_dataplus._M_p,local_8278._M_string_length,false)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The velocypack in infile \'",0x1a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_8298._M_dataplus._M_p,
                        local_8298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' is valid",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::ifstream::~ifstream(&local_8240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8278._M_dataplus._M_p != &local_8278.field_2) {
    operator_delete(local_8278._M_dataplus._M_p,
                    CONCAT71(local_8278.field_2._M_allocated_capacity._1_7_,
                             local_8278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8298._M_dataplus._M_p != &local_8298.field_2) {
    operator_delete(local_8298._M_dataplus._M_p,local_8298.field_2._M_allocated_capacity + 1);
  }
  return local_829c;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  bool allowFlags = true;
  bool hex = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;

  try {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
    std::cout << "The velocypack in infile '" << infile << "' is valid"
              << std::endl;
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}